

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

void xmlCleanupInputCallbacks(void)

{
  if (xmlInputCallbackInitialized == '\x01') {
    if (0 < (long)xmlInputCallbackNr) {
      memset(xmlInputCallbackTable,0,(long)xmlInputCallbackNr << 5);
    }
    xmlInputCallbackNr = 0;
    xmlInputCallbackInitialized = '\0';
  }
  return;
}

Assistant:

void
xmlCleanupInputCallbacks(void)
{
    int i;

    if (!xmlInputCallbackInitialized)
        return;

    for (i = xmlInputCallbackNr - 1; i >= 0; i--) {
        xmlInputCallbackTable[i].matchcallback = NULL;
        xmlInputCallbackTable[i].opencallback = NULL;
        xmlInputCallbackTable[i].readcallback = NULL;
        xmlInputCallbackTable[i].closecallback = NULL;
    }

    xmlInputCallbackNr = 0;
    xmlInputCallbackInitialized = 0;
}